

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::anon_unknown_15::JUnitReporter::log_assert(JUnitReporter *this,AssertData *rb)

{
  pointer *ppJVar1;
  int *piVar2;
  pointer pJVar3;
  pointer __first;
  pointer __last;
  char cVar4;
  pthread_mutex_t *__mutex;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  ostream *poVar8;
  IContextScope **ppIVar9;
  AssertData *pAVar10;
  pointer __result;
  pointer pJVar11;
  pointer pJVar12;
  undefined8 uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  long lVar14;
  char *__s;
  uint uVar15;
  String *__s_00;
  undefined1 *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  void *unaff_R12;
  ulong uVar16;
  JUnitReporter *pJVar17;
  long in_FS_OFFSET;
  ostringstream os;
  undefined1 auStack_228 [6];
  allocator<char> local_222;
  allocator<char> local_221;
  AssertData *local_220;
  pthread_mutex_t *local_218;
  JUnitReporter *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [376];
  
  if (rb->m_failed == true) {
    pAVar10 = rb;
    iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
    if (iVar5 != 0) {
      uVar13 = std::__throw_system_error(iVar5);
      __cxa_begin_catch(uVar13);
      if (unaff_R12 == (void *)0x0) {
        std::
        allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
        ::
        destroy<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>
                  ((allocator_type *)rb,(JUnitTestMessage *)pAVar10);
      }
      else {
        operator_delete(unaff_R12,(long)local_220 * 0x60);
      }
      uVar13 = __cxa_rethrow();
      __cxa_end_catch();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
        operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      pthread_mutex_unlock(local_218);
      _Unwind_Resume(uVar13);
    }
    local_218 = (pthread_mutex_t *)&this->mutex;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = skipPathFromFilename(rb->m_file);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)(auStack_228 + (long)*(_func_int **)(local_1a8._0_8_ + -0x18)) + 0x80);
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    pcVar6 = "(";
    if (this->opt->gnu_file_line != false) {
      pcVar6 = ":";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,1);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    uVar16 = (ulong)this->opt->gnu_file_line;
    pcVar6 = "):";
    if (uVar16 != 0) {
      pcVar6 = ":";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,2 - uVar16);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    fulltext_log_assert_to_stream((ostream *)local_1a8,rb);
    detail::g_infoContexts::__tls_init();
    uVar15 = (uint)((ulong)(*(long *)(in_FS_OFFSET + -0x28) - *(long *)(in_FS_OFFSET + -0x30)) >> 3)
    ;
    local_220 = rb;
    local_210 = this;
    if (uVar15 != 0) {
      ppIVar9 = IReporter::get_active_contexts();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  logged: ",10);
      if (0 < (int)uVar15) {
        uVar16 = 0;
        do {
          pcVar6 = "          ";
          if (uVar16 == 0) {
            pcVar6 = "";
          }
          lVar14 = 10;
          if (uVar16 == 0) {
            lVar14 = 0;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar14);
          (*ppIVar9[uVar16]->_vptr_IContextScope[2])(ppIVar9[uVar16],(ostream *)local_1a8);
          cVar4 = (char)(ostream *)local_1a8;
          std::ios::widen((char)*(_func_int **)(local_1a8._0_8_ + -0x18) + cVar4);
          std::ostream::put(cVar4);
          std::ostream::flush();
          uVar16 = uVar16 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar16);
      }
    }
    pAVar10 = local_220;
    if ((local_220->m_decomp).field_0.buf[0x17] < '\0') {
      __s_00 = (String *)(local_220->m_decomp).field_0.data.ptr;
    }
    else {
      __s_00 = &local_220->m_decomp;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,(char *)__s_00,&local_221);
    pcVar6 = assertString(pAVar10->m_at);
    pJVar17 = local_210;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar6,&local_222);
    __n = local_1a8 + 8;
    std::__cxx11::stringbuf::str();
    pJVar3 = (pJVar17->testCaseData).testcases.
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pJVar12 = pJVar3[-1].failures.
              super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pJVar12 ==
        pJVar3[-1].failures.
        super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pAVar10 = (AssertData *)
                std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::_M_check_len(&pJVar3[-1].failures,(size_type)__n,__s);
      __first = pJVar3[-1].failures.
                super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __last = pJVar3[-1].failures.
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ::_M_allocate((_Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                                *)pAVar10,(size_t)__n);
      __args_1 = &local_208;
      local_220 = pAVar10;
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)(((long)pJVar12 - (long)__first) + (long)__result),
                 (JUnitTestMessage *)local_1c8,&local_1e8,__args_1,in_R8);
      pJVar11 = std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::_S_relocate(__first,pJVar12,__result,(_Tp_alloc_type *)__args_1);
      pJVar12 = std::
                vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                ::_S_relocate(pJVar12,__last,pJVar11 + 1,(_Tp_alloc_type *)__args_1);
      pJVar17 = local_210;
      if (__first != (pointer)0x0) {
        operator_delete(__first,(long)pJVar3[-1].failures.
                                      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first);
      }
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_finish = pJVar12;
      pJVar3[-1].failures.
      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)local_220;
    }
    else {
      std::
      allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>>
      ::
      construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((allocator_type *)pJVar12,(JUnitTestMessage *)local_1c8,&local_1e8,&local_208,in_R8
                );
      ppJVar1 = &pJVar3[-1].failures.
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppJVar1 = *ppJVar1 + 1;
    }
    __mutex = local_218;
    piVar2 = &(pJVar17->testCaseData).totalFailures;
    *piVar2 = *piVar2 + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void log_assert(const AssertData& rb) override {
            if(!rb.m_failed) // report only failures & ignore the `success` option
                return;

            DOCTEST_LOCK_MUTEX(mutex)

            std::ostringstream os;
            os << skipPathFromFilename(rb.m_file) << (opt.gnu_file_line ? ":" : "(")
              << line(rb.m_line) << (opt.gnu_file_line ? ":" : "):") << std::endl;

            fulltext_log_assert_to_stream(os, rb);
            log_contexts(os);
            testCaseData.addFailure(rb.m_decomp.c_str(), assertString(rb.m_at), os.str());
        }